

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorsC.cpp
# Opt level: O0

char * SoapySDR_errToStr(int errorCode)

{
  int errorCode_local;
  char *local_8;
  
  switch(errorCode) {
  case -7:
    local_8 = "UNDERFLOW";
    break;
  case -6:
    local_8 = "TIME_ERROR";
    break;
  case -5:
    local_8 = "NOT_SUPPORTED";
    break;
  case -4:
    local_8 = "OVERFLOW";
    break;
  case -3:
    local_8 = "CORRUPTION";
    break;
  case -2:
    local_8 = "STREAM_ERROR";
    break;
  case -1:
    local_8 = "TIMEOUT";
    break;
  default:
    local_8 = "UNKNOWN";
  }
  return local_8;
}

Assistant:

const char *SoapySDR_errToStr(const int errorCode)
{
    switch(errorCode)
    {
    case SOAPY_SDR_TIMEOUT:         return "TIMEOUT";
    case SOAPY_SDR_STREAM_ERROR:    return "STREAM_ERROR";
    case SOAPY_SDR_CORRUPTION:      return "CORRUPTION";
    case SOAPY_SDR_OVERFLOW:        return "OVERFLOW";
    case SOAPY_SDR_NOT_SUPPORTED:   return "NOT_SUPPORTED";
    case SOAPY_SDR_TIME_ERROR:      return "TIME_ERROR";
    case SOAPY_SDR_UNDERFLOW:       return "UNDERFLOW";
    default: break;
    }
    return "UNKNOWN";
}